

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O2

_Bool xdr_nreplymsg(XDR *xdrs,rpc_msg *rmsg)

{
  reply_body *__ep;
  xdr_discrim *pxVar1;
  xdrproc_t UNRECOVERED_JUMPTABLE;
  _Bool _Var2;
  bool_t bVar3;
  xdrproc_t *pp_Var4;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x90,"_Bool xdr_nreplymsg(XDR *, struct rpc_msg *)");
  }
  if (rmsg != (rpc_msg *)0x0) {
    _Var2 = xdr_u_int32_t(xdrs,&rmsg->rm_xid);
    if (_Var2) {
      bVar3 = xdr_enum((XDR *)xdrs,(enum_t *)&rmsg->rm_direction);
      if (((char)bVar3 != '\0') && (rmsg->rm_direction == REPLY)) {
        __ep = &(rmsg->ru).RM_rmb;
        bVar3 = xdr_enum((XDR *)xdrs,(enum_t *)__ep);
        if ((char)bVar3 != '\0') {
          pp_Var4 = &reply_dscrm[0].proc;
          while (UNRECOVERED_JUMPTABLE = *pp_Var4, UNRECOVERED_JUMPTABLE != (xdrproc_t)0x0) {
            pxVar1 = (xdr_discrim *)(pp_Var4 + -1);
            pp_Var4 = pp_Var4 + 2;
            if (pxVar1->value == __ep->rp_stat) {
              _Var2 = (*UNRECOVERED_JUMPTABLE)(xdrs,&(rmsg->ru).RM_rmb.ru);
              return _Var2;
            }
          }
        }
      }
    }
    return false;
  }
  __assert_fail("rmsg != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                ,0x91,"_Bool xdr_nreplymsg(XDR *, struct rpc_msg *)");
}

Assistant:

bool
xdr_nreplymsg(XDR *xdrs, struct rpc_msg *rmsg)
{
	assert(xdrs != NULL);
	assert(rmsg != NULL);

	if (inline_xdr_u_int32_t(xdrs, &(rmsg->rm_xid))
	    && inline_xdr_enum(xdrs, (enum_t *) &(rmsg->rm_direction))
	    && (rmsg->rm_direction == REPLY))
		return (inline_xdr_union(xdrs,
					 (enum_t *)&(rmsg->rm_reply.rp_stat),
					 (void *)&(rmsg->rm_reply.ru),
					 reply_dscrm, NULL_xdrproc_t));
	return (false);
}